

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall
bloaty::RangeMapTest_UnknownSize3_Test::TestBody(RangeMapTest_UnknownSize3_Test *this)

{
  RangeMap *this_00;
  pointer pcVar1;
  uint64_t uVar2;
  long lVar3;
  long *plVar4;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_a9;
  undefined1 local_a8 [24];
  string local_90 [16];
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined8 local_68;
  uint64_t local_60;
  long *local_58 [2];
  long local_48 [2];
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_38;
  
  uVar2 = (this->super_RangeMapTest).kUnknownSize;
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,uVar2,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  uVar2 = (this->super_RangeMapTest).kUnknownSize;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"bar","");
  RangeMap::AddRange(this_00,0x96,uVar2,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"baz","");
  RangeMap::AddRange(this_00,100,100,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = (pointer)0x64;
  local_a8._8_8_ = 0x96;
  local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>(local_90,"foo","");
  local_70 = 0x96;
  local_68 = 200;
  local_60 = (this->super_RangeMapTest).kNoTranslation;
  plVar4 = local_48;
  local_58[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bar","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_a8;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_38,__l,&local_a9);
  RangeMapTest::AssertMapEquals(&this->super_RangeMapTest,this_00,&local_38);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_38);
  lVar3 = -0x70;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -7;
    lVar3 = lVar3 + 0x38;
  } while (lVar3 != 0);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize3) {
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(150, kUnknownSize, "bar");
  // This tells us the ultimate size of "foo", and we keep the "foo" label even
  // though the new label is "baz".
  map_.AddRange(100, 100, "baz");
  AssertMainMapEquals({
    {100, 150, kNoTranslation, "foo"},
    {150, 200, kNoTranslation, "bar"},
  });
}